

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  bool bVar1;
  ImGuiContext *ctx;
  bool bVar2;
  bool bVar3;
  ImGuiDockNode *this;
  bool dragging;
  bool clicked;
  ImGuiDockNode *root_node;
  bool can_undock_node;
  ImGuiContext *g;
  bool undock_floating_node_local;
  ImGuiDockNode *node_local;
  ImGuiWindow *window_local;
  
  ctx = GImGui;
  bVar1 = false;
  if ((((node != (ImGuiDockNode *)0x0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
      ((node->VisibleWindow->Flags & 4U) == 0)) &&
     (((this = DockNodeGetRootNode(node), this->OnlyNodeWithWindows != node ||
       (this->CentralNode != (ImGuiDockNode *)0x0)) &&
      ((undock_floating_node || (bVar2 = ImGuiDockNode::IsDockSpace(this), bVar2)))))) {
    bVar1 = true;
  }
  bVar2 = IsMouseClicked(0,false);
  bVar3 = IsMouseDragging(0,(ctx->IO).MouseDragThreshold * 1.7);
  if ((bVar1) && (bVar3)) {
    DockContextQueueUndockNode(ctx,node);
  }
  else if ((!bVar1) && (((bVar2 || (bVar3)) && (ctx->MovingWindow != window)))) {
    StartMouseMovingWindow(window);
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)   // -V1051 PVS-Studio thinks node should be root_node and is wrong about that.
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
        DockContextQueueUndockNode(&g, node); // Will lead to DockNodeStartMouseMovingWindow() -> StartMouseMovingWindow() being called next frame
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
        StartMouseMovingWindow(window);
}